

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void constructor(LexState *ls,expdesc *t)

{
  byte bVar1;
  FuncState *fs;
  int pc;
  int iVar2;
  int iVar3;
  ConsControl cc;
  
  fs = ls->fs;
  iVar3 = ls->linenumber;
  pc = luaK_codeABCk(fs,OP_NEWTABLE,0,0,0,0);
  luaK_code(fs,0);
  cc.tostore = 0;
  cc.nh = 0;
  cc.na = 0;
  bVar1 = fs->freereg;
  t->t = -1;
  t->f = -1;
  t->k = VNONRELOC;
  *(uint *)&t->u = (uint)bVar1;
  cc.t = t;
  luaK_reserveregs(fs,1);
  cc.v.t = -1;
  cc.v.f = -1;
  cc.v.k = VVOID;
  cc.v.u.info = 0;
  checknext(ls,0x7b);
  do {
    do {
      iVar2 = (ls->t).token;
      if (iVar2 == 0x7d) goto LAB_0012c79a;
      if (cc.v.k != VVOID) {
        luaK_exp2nextreg(fs,&cc.v);
        cc.v.k = VVOID;
        if (cc.tostore == 0x32) {
          luaK_setlist(fs,((cc.t)->u).info,cc.na,0x32);
          cc.na = cc.na + cc.tostore;
          cc.tostore = 0;
        }
        iVar2 = (ls->t).token;
      }
      if (iVar2 == 0x5b) {
LAB_0012c75d:
        recfield(ls,&cc);
      }
      else {
        if (iVar2 == 0x123) {
          iVar2 = luaX_lookahead(ls);
          if (iVar2 == 0x3d) goto LAB_0012c75d;
        }
        listfield(ls,&cc);
      }
      iVar2 = testnext(ls,0x2c);
    } while (iVar2 != 0);
    iVar2 = testnext(ls,0x3b);
  } while (iVar2 != 0);
LAB_0012c79a:
  check_match(ls,0x7d,0x7b,iVar3);
  if (cc.tostore == 0) {
    iVar3 = cc.na;
  }
  else {
    if (cc.v.k - VCALL < 2) {
      luaK_setreturns(fs,&cc.v,-1);
      luaK_setlist(fs,((cc.t)->u).info,cc.na,-1);
      iVar3 = cc.na + -1;
    }
    else {
      if (cc.v.k != VVOID) {
        luaK_exp2nextreg(fs,&cc.v);
      }
      luaK_setlist(fs,((cc.t)->u).info,cc.na,cc.tostore);
      iVar3 = cc.na;
    }
    cc.na = iVar3 + cc.tostore;
    iVar3 = iVar3 + cc.tostore;
  }
  luaK_settablesize(fs,pc,(t->u).info,iVar3,cc.nh);
  return;
}

Assistant:

static void constructor (LexState *ls, expdesc *t) {
  /* constructor -> '{' [ field { sep field } [sep] ] '}'
     sep -> ',' | ';' */
  FuncState *fs = ls->fs;
  int line = ls->linenumber;
  int pc = luaK_codeABC(fs, OP_NEWTABLE, 0, 0, 0);
  ConsControl cc;
  luaK_code(fs, 0);  /* space for extra arg. */
  cc.na = cc.nh = cc.tostore = 0;
  cc.t = t;
  init_exp(t, VNONRELOC, fs->freereg);  /* table will be at stack top */
  luaK_reserveregs(fs, 1);
  init_exp(&cc.v, VVOID, 0);  /* no value (yet) */
  checknext(ls, '{');
  do {
    lua_assert(cc.v.k == VVOID || cc.tostore > 0);
    if (ls->t.token == '}') break;
    closelistfield(fs, &cc);
    field(ls, &cc);
  } while (testnext(ls, ',') || testnext(ls, ';'));
  check_match(ls, '}', '{', line);
  lastlistfield(fs, &cc);
  luaK_settablesize(fs, pc, t->u.info, cc.na, cc.nh);
}